

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O0

AggregateFunction * duckdb::GetFirstFunction<false,true>(LogicalType *type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalTypeId LVar2;
  PhysicalType PVar3;
  LogicalType *return_type;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *function;
  LogicalType *in_stack_fffffffffffffcf8;
  LogicalType *in_stack_fffffffffffffd00;
  LogicalType *in_stack_fffffffffffffd08;
  size_type in_stack_fffffffffffffd10;
  LogicalType *in_stack_fffffffffffffd48;
  undefined1 **local_280;
  LogicalType *in_stack_fffffffffffffd98;
  aggregate_update_t in_stack_fffffffffffffda8;
  aggregate_initialize_t in_stack_fffffffffffffdb0;
  aggregate_size_t in_stack_fffffffffffffdb8;
  LogicalType *in_stack_fffffffffffffdc0;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffdc8;
  AggregateFunction *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffe08;
  FunctionNullHandling null_handling;
  LogicalType *in_stack_fffffffffffffe18;
  aggregate_simple_update_t in_stack_fffffffffffffe20;
  AggregateFunction *destructor;
  aggregate_statistics_t in_stack_fffffffffffffe38;
  aggregate_window_t window;
  aggregate_serialize_t in_stack_fffffffffffffe48;
  aggregate_deserialize_t in_stack_fffffffffffffe50;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_11;
  LogicalType *local_10;
  
  null_handling = (FunctionNullHandling)((ulong)in_stack_fffffffffffffe08 >> 0x38);
  destructor = in_RDI;
  local_10 = in_RSI;
  LVar2 = LogicalType::id(in_RSI);
  if (LVar2 == DECIMAL) {
    LogicalType::Verify(local_10);
    local_11 = 0;
    GetDecimalFirstFunction<false,true>(in_stack_fffffffffffffd98);
    vector<duckdb::LogicalType,_true>::operator[]
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd00,
               (size_type)in_stack_fffffffffffffcf8);
    LogicalType::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    LogicalType::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  }
  else {
    PVar3 = LogicalType::InternalType(local_10);
    return_type = (LogicalType *)(ulong)(byte)(PVar3 + 0x38);
    switch(return_type) {
    case (LogicalType *)0x0:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      AggregateFunction::
      UnaryAggregate<duckdb::FirstState<duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::FirstFunctionString<false,true>,(duckdb::AggregateDestructorType)0>
                (in_stack_fffffffffffffe18,return_type,null_handling);
      LogicalType::~LogicalType((LogicalType *)0xf5604e);
      break;
    default:
      window = (aggregate_window_t)&stack0xfffffffffffffe48;
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_1a0 = &stack0xfffffffffffffe48;
      local_198 = 1;
      ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xf560c9);
      iVar1._M_len = in_stack_fffffffffffffd10;
      iVar1._M_array = in_stack_fffffffffffffd08;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd00,iVar1,
                 (allocator_type *)in_stack_fffffffffffffcf8);
      AggregateFunction::AggregateFunction
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 (aggregate_combine_t)return_type,(aggregate_finalize_t)in_stack_fffffffffffffe18,
                 in_stack_fffffffffffffe20,(bind_aggregate_function_t)in_RDI,
                 (aggregate_destructor_t)destructor,in_stack_fffffffffffffe38,window,
                 in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xf5618c);
      ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xf56199);
      local_280 = &local_1a0;
      do {
        local_280 = local_280 + -3;
        LogicalType::~LogicalType((LogicalType *)0xf561cb);
      } while (local_280 != (undefined1 **)&stack0xfffffffffffffe48);
      break;
    case (LogicalType *)0x3:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<duckdb::uhugeint_t,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55e8c);
      break;
    case (LogicalType *)0x4:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<duckdb::hugeint_t,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55e20);
      break;
    case (LogicalType *)0x39:
    case (LogicalType *)0x3b:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<signed_char,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55ac0);
      break;
    case (LogicalType *)0x3a:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<unsigned_char,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55c70);
      break;
    case (LogicalType *)0x3c:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<unsigned_short,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55cdc);
      break;
    case (LogicalType *)0x3d:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<short,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55b2c);
      break;
    case (LogicalType *)0x3e:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<unsigned_int,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55d48);
      break;
    case (LogicalType *)0x3f:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<int,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55b98);
      break;
    case (LogicalType *)0x40:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<unsigned_long,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55db4);
      break;
    case (LogicalType *)0x41:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<long,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55c04);
      break;
    case (LogicalType *)0x43:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<float,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55ef8);
      break;
    case (LogicalType *)0x44:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<double,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55f64);
      break;
    case (LogicalType *)0x4d:
      LogicalType::LogicalType(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      GetFirstAggregateTemplated<duckdb::interval_t,false,true>(in_stack_fffffffffffffd48);
      LogicalType::~LogicalType((LogicalType *)0xf55fd0);
    }
  }
  return destructor;
}

Assistant:

static AggregateFunction GetFirstFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::DECIMAL) {
		type.Verify();
		AggregateFunction function = GetDecimalFirstFunction<LAST, SKIP_NULLS>(type);
		function.arguments[0] = type;
		function.return_type = type;
		return function;
	}
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return GetFirstAggregateTemplated<int8_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT16:
		return GetFirstAggregateTemplated<int16_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT32:
		return GetFirstAggregateTemplated<int32_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT64:
		return GetFirstAggregateTemplated<int64_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT8:
		return GetFirstAggregateTemplated<uint8_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT16:
		return GetFirstAggregateTemplated<uint16_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT32:
		return GetFirstAggregateTemplated<uint32_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT64:
		return GetFirstAggregateTemplated<uint64_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::INT128:
		return GetFirstAggregateTemplated<hugeint_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::UINT128:
		return GetFirstAggregateTemplated<uhugeint_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::FLOAT:
		return GetFirstAggregateTemplated<float, LAST, SKIP_NULLS>(type);
	case PhysicalType::DOUBLE:
		return GetFirstAggregateTemplated<double, LAST, SKIP_NULLS>(type);
	case PhysicalType::INTERVAL:
		return GetFirstAggregateTemplated<interval_t, LAST, SKIP_NULLS>(type);
	case PhysicalType::VARCHAR:
		if (LAST) {
			return AggregateFunction::UnaryAggregateDestructor<FirstState<string_t>, string_t, string_t,
			                                                   FirstFunctionString<LAST, SKIP_NULLS>>(type, type);
		} else {
			return AggregateFunction::UnaryAggregate<FirstState<string_t>, string_t, string_t,
			                                         FirstFunctionString<LAST, SKIP_NULLS>>(type, type);
		}
	default: {
		using OP = FirstVectorFunction<LAST, SKIP_NULLS>;
		using STATE = FirstState<string_t>;
		return AggregateFunction(
		    {type}, type, AggregateFunction::StateSize<STATE>, AggregateFunction::StateInitialize<STATE, OP>,
		    OP::Update, AggregateFunction::StateCombine<STATE, OP>, AggregateFunction::StateVoidFinalize<STATE, OP>,
		    nullptr, OP::Bind, LAST ? AggregateFunction::StateDestroy<STATE, OP> : nullptr, nullptr, nullptr);
	}
	}
}